

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn_live.c
# Opt level: O0

void cmn_live(cmn_t *cmn,mfcc_t **incep,int32 varnorm,int32 nfr)

{
  int local_28;
  int local_24;
  int32 j;
  int32 i;
  int32 nfr_local;
  int32 varnorm_local;
  mfcc_t **incep_local;
  cmn_t *cmn_local;
  
  if (0 < nfr) {
    if (varnorm != 0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn_live.c"
              ,0x9a,"Variance normalization not implemented in live mode decode\n");
      exit(1);
    }
    for (local_24 = 0; local_24 < nfr; local_24 = local_24 + 1) {
      if (0.0 < (float)*incep[local_24] || (float)*incep[local_24] == 0.0) {
        for (local_28 = 0; local_28 < cmn->veclen; local_28 = local_28 + 1) {
          cmn->sum[local_28] =
               (mfcc_t)((float)incep[local_24][local_28] + (float)cmn->sum[local_28]);
          incep[local_24][local_28] =
               (mfcc_t)((float)incep[local_24][local_28] - (float)cmn->cmn_mean[local_28]);
        }
        cmn->nframe = cmn->nframe + 1;
      }
    }
    if (800 < cmn->nframe) {
      cmn_live_shiftwin(cmn);
    }
  }
  return;
}

Assistant:

void
cmn_live(cmn_t *cmn, mfcc_t **incep, int32 varnorm, int32 nfr)
{
    int32 i, j;

    if (nfr <= 0)
        return;

    if (varnorm)
        E_FATAL
            ("Variance normalization not implemented in live mode decode\n");

    for (i = 0; i < nfr; i++) {

	/* Skip zero energy frames */
	if (incep[i][0] < 0)
	    continue;

        for (j = 0; j < cmn->veclen; j++) {
            cmn->sum[j] += incep[i][j];
            incep[i][j] -= cmn->cmn_mean[j];
        }

        ++cmn->nframe;
    }

    /* Shift buffer down if we have more than CMN_WIN_HWM frames */
    if (cmn->nframe > CMN_WIN_HWM)
        cmn_live_shiftwin(cmn);
}